

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O0

void redistribute_nd(int *dim,int *pdim,int ndim,int *pidx,int size,int *embed,cpx_t *work,
                    cpx_t *scratch,int *dfft_nsend,int *dfft_nrecv,int *dfft_offset_send,
                    int *dfft_offset_recv,int c2b,MPI_Comm comm,int *proc_map,int row_m)

{
  int *in_RCX;
  int in_EDX;
  int *unaff_RBX;
  int *in_RSI;
  MPI_Comm in_RDI;
  int in_R8D;
  cpx_t *in_R9;
  undefined8 unaff_R12;
  undefined8 unaff_R13;
  int *unaff_R14;
  int *unaff_R15;
  int *unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int *in_stack_00000018;
  cpx_t *in_stack_00000020;
  cpx_t *in_stack_00000028;
  int *in_stack_00000030;
  int in_stack_00000038;
  undefined4 in_stack_0000003c;
  int *in_stack_00000040;
  int *in_stack_00000048;
  int in_stack_00000050;
  undefined4 in_stack_00000054;
  int *in_stack_00000058;
  MPI_Comm in_stack_00000060;
  int *in_stack_00000068;
  int in_stack_00000070;
  cpx_t *tmp;
  int new_idx;
  int gidx;
  int j;
  int i;
  int stride;
  int l;
  int current_dim;
  cpx_t *cur_scratch;
  cpx_t *cur_work;
  int in_stack_ffffffffffffff60;
  cpx_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_84;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int local_74;
  cpx_t *embed_00;
  cpx_t *work_00;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  
  embed_00 = (cpx_t *)CONCAT44(in_stack_00000014,in_stack_00000010);
  work_00 = (cpx_t *)CONCAT44(in_stack_0000000c,in_stack_00000008);
  for (local_74 = 0; local_74 < in_EDX; local_74 = local_74 + 1) {
    if (in_stack_00000038 == 0) {
      dfft_redistribute_block_to_cyclic_1d
                ((int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (int *)in_stack_ffffffffffffff68,in_stack_00000050,in_stack_ffffffffffffff60,
                 (int)((ulong)in_R9 >> 0x20),(int)in_R9,
                 (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff88,(int *)embed_00,work_00,in_R9,
                 (int *)CONCAT44(in_R8D,in_stack_ffffffffffffffa8),in_RCX,
                 (int *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8),in_RSI,in_RDI,unaff_RBX,
                 (int)unaff_R12);
      in_stack_ffffffffffffff68 = embed_00;
      embed_00 = work_00;
    }
    else {
      dfft_redistribute_cyclic_to_block_1d
                (unaff_R15,unaff_R14,(int)((ulong)unaff_R13 >> 0x20),(int)unaff_R13,
                 (int)((ulong)unaff_R12 >> 0x20),(int)unaff_R12,unaff_retaddr,in_stack_00000008,
                 in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
                 in_stack_00000030,(int *)CONCAT44(in_stack_0000003c,in_stack_00000038),
                 in_stack_00000040,in_stack_00000048,
                 (int *)CONCAT44(in_stack_00000054,in_stack_00000050),in_stack_00000058,
                 in_stack_00000060,in_stack_00000068,in_stack_00000070);
      in_stack_ffffffffffffff68 = embed_00;
      embed_00 = work_00;
    }
    in_stack_ffffffffffffff88 = *(int *)(in_RDI + (long)local_74 * 4) / in_RSI[local_74];
    in_stack_ffffffffffffff84 = in_R8D / (int)(&in_R9->x)[local_74];
    for (in_stack_ffffffffffffff80 = 0; in_stack_ffffffffffffff80 < in_stack_ffffffffffffff88;
        in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 + 1) {
      for (local_84 = 0; local_84 < in_stack_ffffffffffffff84; local_84 = local_84 + 1) {
        in_stack_ffffffffffffff74 =
             local_84 * (int)(&in_R9->x)[local_74] + in_stack_ffffffffffffff80;
        in_stack_ffffffffffffff68[in_stack_ffffffffffffff74] =
             embed_00[local_84 + in_stack_ffffffffffffff80 * in_stack_ffffffffffffff84];
      }
    }
    work_00 = in_stack_ffffffffffffff68;
  }
  if (in_EDX % 2 != 0) {
    memcpy((void *)CONCAT44(in_stack_0000000c,in_stack_00000008),
           (void *)CONCAT44(in_stack_00000014,in_stack_00000010),(long)in_R8D << 3);
  }
  return;
}

Assistant:

void redistribute_nd(int *dim,
            int *pdim,
            int ndim,
            int* pidx,
            int size,
            int *embed,
            cpx_t *work,
            cpx_t *scratch,
            int *dfft_nsend,
            int *dfft_nrecv,
            int *dfft_offset_send,
            int *dfft_offset_recv,
            int c2b,
            MPI_Comm comm,
            int *proc_map,
            int row_m)
    {
    cpx_t *cur_work =work;
    cpx_t *cur_scratch =scratch;

    int current_dim;
    for (current_dim = 0; current_dim < ndim; ++current_dim)
        {
        /* redistribute along one dimension (in-place) */
        if (!c2b)
            dfft_redistribute_block_to_cyclic_1d(dim, pdim, ndim, current_dim,
                1, pdim[current_dim], pidx, size, embed,
                cur_work, cur_scratch, dfft_nsend,dfft_nrecv,
                dfft_offset_send, dfft_offset_recv, comm, proc_map, row_m);
        else
            dfft_redistribute_cyclic_to_block_1d(dim, pdim, ndim, current_dim,
                pdim[current_dim], 1, pidx, 0, size, embed, cur_work,
                cur_scratch, NULL, NULL, dfft_nsend,
                dfft_nrecv, dfft_offset_send, dfft_offset_recv, comm, proc_map, row_m);

        int l = dim[current_dim]/pdim[current_dim];
        int stride = size/embed[current_dim];

        /* transpose local matrix from column major to row major */
        int i;
        #pragma omp parallel for private(i)
        for (i = 0; i < l; ++i)
            {
            int j;
            for (j = 0; j < stride; ++j)
                {
                int gidx = j+i*stride;
                int new_idx = j*embed[current_dim]+i;
                cur_scratch[new_idx] =cur_work[gidx];
                }
            }

        /* swap buffers */
        cpx_t *tmp;
        tmp = cur_scratch;
        cur_scratch = cur_work;
        cur_work = tmp;
        }

    if (ndim % 2)
        {
        memcpy(work, scratch, sizeof(cpx_t)*size);
        }
    }